

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pad-reflect-1d.cpp
# Opt level: O1

void test_pad_reflect_1d(bool use_gpu)

{
  void *pvVar1;
  char cVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  long lVar7;
  size_t sVar8;
  ggml_tensor *pgVar9;
  ggml_tensor *t;
  ggml_tensor *t_00;
  undefined8 uVar10;
  long lVar11;
  undefined8 *puVar12;
  float *pfVar13;
  byte bVar14;
  float input_data [4];
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  
  bVar14 = 0;
  fprintf(_stderr,"%s: using CPU backend\n","test_pad_reflect_1d");
  uVar3 = ggml_backend_cpu_init();
  ggml_log_set(ggml_log_callback_default,0);
  uVar4 = ggml_init();
  uVar5 = ggml_backend_alloc_buffer(uVar3,0x1000000);
  ggml_tallocr_new(&local_58,uVar5);
  uVar6 = ggml_backend_get_default_buffer_type(uVar3);
  uVar6 = ggml_gallocr_new(uVar6);
  lVar7 = ggml_new_tensor_1d(uVar4,0,4);
  input_data[0] = 1.0;
  input_data[1] = 2.0;
  input_data[2] = 3.0;
  input_data[3] = 4.0;
  ggml_tallocr_alloc(&local_58,lVar7);
  cVar2 = ggml_backend_is_cpu(uVar3);
  if (cVar2 == '\0') {
    uVar10 = ggml_nbytes(lVar7);
    ggml_backend_tensor_set(lVar7,input_data,0,uVar10);
  }
  else {
    pvVar1 = *(void **)(lVar7 + 0xf8);
    sVar8 = ggml_nbytes(lVar7);
    memcpy(pvVar1,input_data,sVar8);
  }
  pgVar9 = (ggml_tensor *)ggml_pad_reflect_1d(uVar4,lVar7,1,1);
  t = (ggml_tensor *)ggml_pad_reflect_1d(uVar4,lVar7,2,1);
  t_00 = (ggml_tensor *)ggml_pad_reflect_1d(uVar4,lVar7,1,2);
  uVar10 = ggml_new_graph(uVar4);
  ggml_build_forward_expand(uVar10,pgVar9);
  ggml_build_forward_expand(uVar10,t);
  ggml_build_forward_expand(uVar10,t_00);
  ggml_gallocr_alloc_graph(uVar6,uVar10);
  ggml_backend_graph_compute(uVar3,uVar10);
  check_tensor(pgVar9,(float *)&DAT_00102030,6,1,1);
  check_tensor(t,(float *)&DAT_00102050,7,1,1);
  check_tensor(t_00,(float *)&DAT_00102070,7,1,1);
  ggml_free(uVar4);
  ggml_backend_buffer_free(uVar5);
  ggml_gallocr_free(uVar6);
  ggml_log_set(ggml_log_callback_default,0);
  uVar4 = ggml_init();
  uVar5 = ggml_backend_alloc_buffer(uVar3,0x1000000);
  ggml_tallocr_new(input_data,uVar5);
  local_58 = input_data[0];
  fStack_54 = input_data[1];
  fStack_50 = input_data[2];
  fStack_4c = input_data[3];
  uVar6 = ggml_backend_get_default_buffer_type(uVar3);
  uVar6 = ggml_gallocr_new(uVar6);
  lVar11 = ggml_new_tensor_2d(uVar4,0,5,4);
  puVar12 = &DAT_00102090;
  pfVar13 = input_data;
  for (lVar7 = 10; lVar7 != 0; lVar7 = lVar7 + -1) {
    *(undefined8 *)pfVar13 = *puVar12;
    puVar12 = puVar12 + (ulong)bVar14 * -2 + 1;
    pfVar13 = pfVar13 + (ulong)bVar14 * -4 + 2;
  }
  ggml_tallocr_alloc(&local_58,lVar11);
  cVar2 = ggml_backend_is_cpu(uVar3);
  if (cVar2 == '\0') {
    uVar10 = ggml_nbytes(lVar11);
    ggml_backend_tensor_set(lVar11,input_data,0,uVar10);
  }
  else {
    pvVar1 = *(void **)(lVar11 + 0xf8);
    sVar8 = ggml_nbytes(lVar11);
    memcpy(pvVar1,input_data,sVar8);
  }
  pgVar9 = (ggml_tensor *)ggml_pad_reflect_1d(uVar4,lVar11,3,2);
  uVar10 = ggml_new_graph(uVar4);
  ggml_build_forward_expand(uVar10,pgVar9);
  ggml_gallocr_alloc_graph(uVar6,uVar10);
  ggml_backend_graph_compute(uVar3,uVar10);
  check_tensor(pgVar9,(float *)&DAT_001020e0,10,4,1);
  ggml_free(uVar4);
  ggml_gallocr_free(uVar6);
  ggml_backend_buffer_free(uVar5);
  ggml_backend_free(uVar3);
  return;
}

Assistant:

void test_pad_reflect_1d(bool use_gpu) {
    ggml_backend_t backend = NULL;
    struct ggml_init_params params;
    ggml_backend_buffer_t buffer;
    struct ggml_context * ctx;
    struct ggml_tallocr tallocr;
    ggml_gallocr_t gallocr;

    // initialize the backend
#ifdef GGML_USE_CUDA
    if (use_gpu) {
        fprintf(stderr, "%s: using CUDA backend\n", __func__);
        backend = ggml_backend_cuda_init(0);
        if (!backend) {
            fprintf(stderr, "%s: ggml_backend_cuda_init() failed\n", __func__);
        }
    }
#endif

#ifdef GGML_USE_METAL
    if (use_gpu) {
        fprintf(stderr, "%s: using Metal backend\n", __func__);
        backend = ggml_backend_metal_init();
        if (!backend) {
            fprintf(stderr, "%s: ggml_backend_metal_init() failed\n", __func__);
        }
    }
#endif

    if (!backend) {
        fprintf(stderr, "%s: using CPU backend\n", __func__);
        backend = ggml_backend_cpu_init();
    }

    // Test cases for different padding configurations
    {
        params = ggml_init_params{
            /*.mem_size   =*/ 16*1024*1024,
            /*.mem_buffer =*/ nullptr,
            /*.no_alloc.  =*/ true
        };

        ggml_log_set(ggml_log_callback_default, nullptr);

        ctx = ggml_init(params);
        buffer = ggml_backend_alloc_buffer(backend, 16*1024*1024);
        tallocr = ggml_tallocr_new(buffer);
        gallocr = ggml_gallocr_new(ggml_backend_get_default_buffer_type(backend));

        // Create a simple 1D input tensor [1, 2, 3, 4]
        struct ggml_tensor * t = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, 4);
        float input_data[] = {1.0f, 2.0f, 3.0f, 4.0f};
        ggml_tallocr_alloc(&tallocr, t);

        // load data to buffer
        if(ggml_backend_is_cpu(backend)) {
            memcpy(t->data, input_data, ggml_nbytes(t));
        } else {
            ggml_backend_tensor_set(t, input_data, 0, ggml_nbytes(t));
        }

        // Test case 1: pad left=1, right=1
        // Expected: [2, 1, 2, 3, 4, 3]
        float expected_1[] = {2.0f, 1.0f, 2.0f, 3.0f, 4.0f, 3.0f};
        struct ggml_tensor * out_1 = ggml_pad_reflect_1d(ctx, t, 1, 1);

        // Test case 2: pad left=2, right=1
        // Expected: [3, 2, 1, 2, 3, 4, 3]
        float expected_2[] = {3.0f, 2.0f, 1.0f, 2.0f, 3.0f, 4.0f, 3.0f};
        struct ggml_tensor * out_2 = ggml_pad_reflect_1d(ctx, t, 2, 1);

        // Test case 3: pad left=1, right=2
        // Expected: [2, 1, 2, 3, 4, 3, 2]
        float expected_3[] = {2.0f, 1.0f, 2.0f, 3.0f, 4.0f, 3.0f, 2.0f};
        struct ggml_tensor * out_3 = ggml_pad_reflect_1d(ctx, t, 1, 2);

        struct ggml_cgraph * gf = ggml_new_graph(ctx);
        ggml_build_forward_expand(gf, out_1);
        ggml_build_forward_expand(gf, out_2);
        ggml_build_forward_expand(gf, out_3);

        ggml_gallocr_alloc_graph(gallocr, gf);

        ggml_backend_graph_compute(backend, gf);

        check_tensor(out_1, expected_1, 6, 1, 1);
        check_tensor(out_2, expected_2, 7, 1, 1);
        check_tensor(out_3, expected_3, 7, 1, 1);

        ggml_free(ctx);
        ggml_backend_buffer_free(buffer);
        ggml_gallocr_free(gallocr);
    }

    {
        params = ggml_init_params{
            /*.mem_size   =*/ 16*1024*1024,
            /*.mem_buffer =*/ nullptr,
            /*.no_alloc.  =*/ true
        };

        ggml_log_set(ggml_log_callback_default, nullptr);

        ctx = ggml_init(params);
        buffer = ggml_backend_alloc_buffer(backend, 16*1024*1024);
        tallocr = ggml_tallocr_new(buffer);
        gallocr = ggml_gallocr_new(ggml_backend_get_default_buffer_type(backend));

        // Create a 2D input tensor (5 columns × 4 rows)
        struct ggml_tensor * t = ggml_new_tensor_2d(ctx, GGML_TYPE_F32, 5, 4);
        float input_data[] = {
            1.0f, 2.0f, 3.0f, 4.0f, 5.0f,  // row 1
            6.0f, 7.0f, 8.0f, 9.0f, 10.0f, // row 2
            11.0f, 12.0f, 13.0f, 14.0f, 15.0f, // row 3
            16.0f, 17.0f, 18.0f, 19.0f, 20.0f  // row 4
        };
        ggml_tallocr_alloc(&tallocr, t);

        // load data to buffer
        if(ggml_backend_is_cpu(backend)) {
            memcpy(t->data, input_data, ggml_nbytes(t));
        } else {
            ggml_backend_tensor_set(t, input_data, 0, ggml_nbytes(t));
        }

        // Test case 4: pad left=3, right=2 on a 2D tensor
        // Each row should be padded independently
        float expected_4[] = {
            4.0f, 3.0f, 2.0f, 1.0f, 2.0f, 3.0f, 4.0f, 5.0f, 4.0f, 3.0f,  // row 1
            9.0f, 8.0f, 7.0f, 6.0f, 7.0f, 8.0f, 9.0f, 10.0f, 9.0f, 8.0f, // row 2
            14.0f, 13.0f, 12.0f, 11.0f, 12.0f, 13.0f, 14.0f, 15.0f, 14.0f, 13.0f, // row 3
            19.0f, 18.0f, 17.0f, 16.0f, 17.0f, 18.0f, 19.0f, 20.0f, 19.0f, 18.0f  // row 4
        };
        struct ggml_tensor * out_4 = ggml_pad_reflect_1d(ctx, t, 3, 2);

        struct ggml_cgraph * gf = ggml_new_graph(ctx);
        ggml_build_forward_expand(gf, out_4);

        ggml_gallocr_alloc_graph(gallocr, gf);

        ggml_backend_graph_compute(backend, gf);

        check_tensor(out_4, expected_4, 10, 4, 1);

        ggml_free(ctx);
        ggml_gallocr_free(gallocr);
        ggml_backend_buffer_free(buffer);
    }

    ggml_backend_free(backend);
}